

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O2

void av1_compute_stats_c(int wiener_win,uint8_t *dgd,uint8_t *src,int16_t *dgd_avg,int16_t *src_avg,
                        int h_start,int h_end,int v_start,int v_end,int dgd_stride,int src_stride,
                        int64_t *M,int64_t *H,int use_downsampled_wiener_stats)

{
  byte bVar1;
  short sVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  int64_t *piVar8;
  long lVar9;
  int64_t *piVar10;
  long lVar11;
  uint8_t *puVar12;
  byte *pbVar13;
  byte *pbVar14;
  long lVar15;
  short *psVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  undefined1 *puVar20;
  int64_t *piVar21;
  ulong uVar22;
  int iVar23;
  long lVar24;
  byte *pbVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  byte local_2740;
  short local_26f8 [56];
  int local_2688 [52];
  undefined1 local_25b8 [9608];
  
  lVar28 = (long)dgd_stride;
  lVar11 = (long)h_start;
  lVar24 = (long)v_start;
  puVar12 = dgd + lVar28 * lVar24;
  uVar4 = 0;
  for (; lVar18 = lVar11, lVar24 < v_end; lVar24 = lVar24 + 1) {
    for (; lVar18 < h_end; lVar18 = lVar18 + 1) {
      uVar4 = uVar4 + puVar12[lVar18];
    }
    puVar12 = puVar12 + lVar28;
  }
  iVar23 = (uint)(use_downsampled_wiener_stats != 0) * 3 + 1;
  uVar26 = (ulong)(uint)(wiener_win * wiener_win);
  memset(M,0,uVar26 * 8);
  memset(H,0,uVar26 * 8 * uVar26);
  local_2740 = (byte)(uVar4 / (ulong)(long)((h_end - h_start) * (v_end - v_start)));
  lVar27 = (long)(wiener_win >> 1);
  lVar5 = (long)-(wiener_win >> 1);
  lVar24 = lVar27 * 2 + 1;
  lVar18 = uVar26 * 4 + 4;
  for (; iVar3 = v_end - v_start, iVar3 != 0 && v_start <= v_end; v_start = v_start + iVar23) {
    if (3 < iVar3) {
      iVar3 = iVar23;
    }
    memset(local_2688,0,0xc4);
    memset(local_25b8,0,0x2584);
    pbVar13 = dgd + (v_start + lVar5) * lVar28 + (lVar11 - lVar27);
    for (lVar9 = lVar11; lVar9 < h_end; lVar9 = lVar9 + 1) {
      bVar1 = src[lVar9 + v_start * src_stride];
      lVar19 = 0;
      pbVar14 = pbVar13;
      for (lVar15 = lVar5; lVar15 <= lVar27; lVar15 = lVar15 + 1) {
        iVar17 = (int)lVar19;
        lVar19 = iVar17 + lVar24;
        pbVar25 = pbVar14;
        for (lVar6 = 0; lVar24 != lVar6; lVar6 = lVar6 + 1) {
          local_26f8[iVar17 + lVar6] = (ushort)*pbVar25 - (ushort)local_2740;
          pbVar25 = pbVar25 + lVar28;
        }
        pbVar14 = pbVar14 + 1;
      }
      psVar16 = local_26f8;
      puVar20 = local_25b8;
      uVar4 = uVar26;
      for (uVar22 = 0; uVar22 != uVar26; uVar22 = uVar22 + 1) {
        sVar2 = local_26f8[uVar22];
        local_2688[uVar22] = local_2688[uVar22] + ((uint)bVar1 - (uint)local_2740) * (int)sVar2;
        for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
          *(int *)(puVar20 + uVar7 * 4) =
               *(int *)(puVar20 + uVar7 * 4) + (int)psVar16[uVar7] * (int)sVar2;
        }
        puVar20 = puVar20 + lVar18;
        psVar16 = psVar16 + 1;
        uVar4 = uVar4 - 1;
      }
      pbVar13 = pbVar13 + 1;
    }
    if (use_downsampled_wiener_stats != 0) {
      iVar23 = iVar3;
    }
    puVar20 = local_25b8;
    piVar8 = H;
    uVar4 = uVar26;
    for (uVar22 = 0; uVar22 != uVar26; uVar22 = uVar22 + 1) {
      M[uVar22] = M[uVar22] + (long)local_2688[uVar22] * (long)iVar23;
      for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
        piVar8[uVar7] = piVar8[uVar7] + (long)*(int *)(puVar20 + uVar7 * 4) * (long)iVar23;
      }
      uVar4 = uVar4 - 1;
      piVar8 = piVar8 + uVar26 + 1;
      puVar20 = puVar20 + lVar18;
    }
  }
  piVar8 = H + uVar26;
  piVar21 = H + 1;
  lVar11 = 1;
  for (uVar4 = 0; uVar4 != uVar26; uVar4 = uVar4 + 1) {
    piVar10 = piVar8;
    for (lVar24 = 0; (ulong)(lVar11 + lVar24) < uVar26; lVar24 = lVar24 + 1) {
      *piVar10 = piVar21[lVar24];
      piVar10 = piVar10 + uVar26;
    }
    lVar11 = lVar11 + 1;
    piVar21 = piVar21 + uVar26 + 1;
    piVar8 = piVar8 + uVar26 + 1;
  }
  return;
}

Assistant:

void av1_compute_stats_c(int wiener_win, const uint8_t *dgd, const uint8_t *src,
                         int16_t *dgd_avg, int16_t *src_avg, int h_start,
                         int h_end, int v_start, int v_end, int dgd_stride,
                         int src_stride, int64_t *M, int64_t *H,
                         int use_downsampled_wiener_stats) {
  (void)dgd_avg;
  (void)src_avg;
  int i, k, l;
  const int wiener_win2 = wiener_win * wiener_win;
  const int wiener_halfwin = (wiener_win >> 1);
  uint8_t avg = find_average(dgd, h_start, h_end, v_start, v_end, dgd_stride);
  int32_t M_row[WIENER_WIN2] = { 0 };
  int32_t H_row[WIENER_WIN2 * WIENER_WIN2] = { 0 };
  int downsample_factor =
      use_downsampled_wiener_stats ? WIENER_STATS_DOWNSAMPLE_FACTOR : 1;

  memset(M, 0, sizeof(*M) * wiener_win2);
  memset(H, 0, sizeof(*H) * wiener_win2 * wiener_win2);

  for (i = v_start; i < v_end; i = i + downsample_factor) {
    if (use_downsampled_wiener_stats &&
        (v_end - i < WIENER_STATS_DOWNSAMPLE_FACTOR)) {
      downsample_factor = v_end - i;
    }

    memset(M_row, 0, sizeof(int32_t) * WIENER_WIN2);
    memset(H_row, 0, sizeof(int32_t) * WIENER_WIN2 * WIENER_WIN2);
    acc_stat_one_line(dgd, src + i * src_stride, dgd_stride, h_start, h_end,
                      avg, wiener_halfwin, wiener_win2, M_row, H_row, i);

    for (k = 0; k < wiener_win2; ++k) {
      // Scale M matrix based on the downsampling factor
      M[k] += ((int64_t)M_row[k] * downsample_factor);
      for (l = k; l < wiener_win2; ++l) {
        // H is a symmetric matrix, so we only need to fill out the upper
        // triangle here. We can copy it down to the lower triangle outside
        // the (i, j) loops.
        // Scale H Matrix based on the downsampling factor
        H[k * wiener_win2 + l] +=
            ((int64_t)H_row[k * wiener_win2 + l] * downsample_factor);
      }
    }
  }

  for (k = 0; k < wiener_win2; ++k) {
    for (l = k + 1; l < wiener_win2; ++l) {
      H[l * wiener_win2 + k] = H[k * wiener_win2 + l];
    }
  }
}